

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xvector.c
# Opt level: O2

void * values_destroy(xvec_t *xv,size_t pos,int count)

{
  uchar *puVar1;
  
  puVar1 = xv->data + pos * xv->val_size;
  for (; 0 < count; count = count + -1) {
    (*xv->destroy_cb)(puVar1);
    puVar1 = puVar1 + xv->val_size;
  }
  return puVar1;
}

Assistant:

static void* values_destroy(xvec_t* xv, size_t pos, int count)
{
    unsigned char* v = xvec_at(xv, pos);

    while (count-- > 0)
    {
        xv->destroy_cb((void*)v);
        v += xv->val_size;
    }

    return (void*)v;
}